

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

Stmt * __thiscall kratos::ActiveVisitor::get_reset_stmt(ActiveVisitor *this,Port *port)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  mapped_type *ppSVar3;
  mapped_type pSVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  Port *local_18;
  Port *port_local;
  
  uVar1 = (this->reset_stmt_)._M_h._M_bucket_count;
  uVar5 = (ulong)port % uVar1;
  p_Var6 = (this->reset_stmt_)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, (Port *)p_Var6->_M_nxt[1]._M_nxt != port)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, (Port *)p_Var2[1]._M_nxt == port)) goto LAB_002000e8;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_002000e8:
  if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
    pSVar4 = (Stmt *)0x0;
  }
  else {
    local_18 = port;
    ppSVar3 = std::__detail::
              _Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_kratos::Stmt_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Stmt_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_kratos::Stmt_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Stmt_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->reset_stmt_,&local_18);
    pSVar4 = *ppSVar3;
  }
  return pSVar4;
}

Assistant:

Stmt* get_reset_stmt(Port* port) const {
        if (reset_stmt_.find(port) != reset_stmt_.end()) return reset_stmt_.at(port);
        return nullptr;
    }